

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellBST::LoadableGetStateBlock_w
          (ChElementShellBST *this,int block_offset,ChStateDelta *mD)

{
  long lVar1;
  long start;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_78;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  start = (long)block_offset;
  for (lVar1 = 0; lVar1 < this->n_usednodes; lVar1 = lVar1 + 1) {
    local_78.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = (PointerType)
              &((this->m_nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->nodes_used_to_six[lVar1]].
                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               field_0x38;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&mD->super_ChVectorDynamic<double>,start,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78
              );
    start = start + 3;
  }
  return;
}

Assistant:

void ChElementShellBST::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
	for (int i = 0; i < n_usednodes; ++i) {
		mD.segment(block_offset + 3 * i, 3) = m_nodes[nodes_used_to_six[i]]->GetPos_dt().eigen();
	}
}